

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  BYTE *ip;
  ulong uVar8;
  ulong *puVar9;
  int iVar10;
  int iVar11;
  ulong *puVar12;
  BYTE *ostart;
  uint uVar13;
  ulong *puVar14;
  ulong uVar15;
  
  if (dstSize < 8) {
    return 0;
  }
  uVar6 = 0;
  uVar7 = 0;
  if (dstSize == 8) {
    return 0;
  }
  puVar14 = (ulong *)((long)dst + (dstSize - 8));
  uVar15 = srcSize & 0xfffffffffffffffc;
  uVar13 = (uint)srcSize & 3;
  uVar8 = (ulong)uVar13;
  switch(uVar13) {
  case 0:
    puVar9 = (ulong *)dst;
    goto LAB_00424268;
  case 1:
    uVar8 = 0;
    goto LAB_00424196;
  case 2:
    uVar8 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar15 + 2);
    uVar8 = (ulong)CTable[bVar1].val;
    uVar7 = (uint)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar15 + 1);
  uVar8 = (ulong)CTable[bVar1].val << ((byte)uVar7 & 0x3f) | uVar8;
  uVar7 = CTable[bVar1].nbBits + uVar7;
LAB_00424196:
  uVar8 = (ulong)CTable[*(byte *)((long)src + uVar15)].val << ((byte)uVar7 & 0x3f) | uVar8;
  uVar7 = CTable[*(byte *)((long)src + uVar15)].nbBits + uVar7;
  puVar9 = (ulong *)((ulong)(uVar7 >> 3) + (long)dst);
  if (puVar14 < puVar9) {
    puVar9 = puVar14;
  }
  *(ulong *)dst = uVar8;
  uVar6 = (ulong)(uVar7 & 7);
  uVar8 = uVar8 >> ((byte)uVar7 & 0x38);
LAB_00424268:
  while (uVar15 != 0) {
    bVar1 = *(byte *)((long)src + (uVar15 - 1));
    iVar10 = (uint)CTable[bVar1].nbBits + (int)uVar6;
    bVar2 = *(byte *)((long)src + (uVar15 - 2));
    iVar5 = (uint)CTable[bVar2].nbBits + iVar10;
    bVar3 = *(byte *)((long)src + (uVar15 - 3));
    iVar11 = (uint)CTable[bVar3].nbBits + iVar5;
    bVar4 = *(byte *)((long)src + (uVar15 - 4));
    uVar15 = uVar15 - 4;
    uVar8 = (ulong)CTable[bVar4].val << ((byte)iVar11 & 0x3f) |
            (ulong)CTable[bVar3].val << ((byte)iVar5 & 0x3f) |
            (ulong)CTable[bVar2].val << ((byte)iVar10 & 0x3f) |
            (ulong)CTable[bVar1].val << (sbyte)uVar6 | uVar8;
    uVar7 = (uint)CTable[bVar4].nbBits + iVar11;
    puVar12 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar9);
    if (puVar14 < puVar12) {
      puVar12 = puVar14;
    }
    *puVar9 = uVar8;
    uVar8 = uVar8 >> ((byte)uVar7 & 0x38);
    uVar6 = (ulong)(uVar7 & 7);
    puVar9 = puVar12;
  }
  uVar7 = (int)uVar6 + 1;
  *puVar9 = uVar8 | 1L << uVar6;
  puVar9 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar9);
  if (puVar14 < puVar9) {
    puVar9 = puVar14;
  }
  if (puVar14 <= puVar9) {
    return 0;
  }
  return (long)puVar9 - ((long)dst + ((ulong)((uVar7 & 7) == 0) - 1));
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}